

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_alloc_strategy.hpp
# Opt level: O1

void __thiscall foxxll::random_cyclic::random_cyclic(random_cyclic *this)

{
  EVP_PKEY_CTX *ctx;
  allocator_type local_19;
  
  striping::striping(&this->super_striping);
  ctx = (EVP_PKEY_CTX *)(this->super_striping).diff_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->perm_,(size_type)ctx,&local_19);
  init(this,ctx);
  return;
}

Assistant:

random_cyclic() : striping(), perm_(diff_)
    {
        init();
    }